

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traceback_template.c
# Opt level: O0

parasail_traceback_t *
parasail_result_get_traceback_striped_16
          (parasail_result_t *result,char *seqA,int lena,char *seqB,int lenb,
          parasail_matrix_t *matrix,char match,char pos,char neg,int case_sensitive,
          char *alphabet_aliases_)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  char *__s;
  char *__s_00;
  char *__s_01;
  long lVar4;
  long lVar5;
  parasail_traceback_t *ppVar6;
  size_t sVar7;
  char *pcVar8;
  char local_1e4;
  int64_t loc;
  parasail_traceback_t *ppStack_1d0;
  int k;
  size_t i_1;
  int64_t segLen;
  int64_t segWidth;
  int16_t *HT;
  long lStack_1a8;
  int where;
  int64_t j;
  int64_t i;
  char *ac;
  char *dc;
  char *qc;
  char *a;
  char *d;
  char *q;
  parasail_traceback_t *traceback;
  size_t aliases_size;
  char alphabet_aliases [256];
  parasail_matrix_t *matrix_local;
  int lenb_local;
  char *seqB_local;
  int lena_local;
  char *seqA_local;
  parasail_result_t *result_local;
  
  traceback = (parasail_traceback_t *)0x0;
  __s = (char *)malloc((long)(lena + lenb + 1));
  __s_00 = (char *)malloc((long)(lena + lenb + 1));
  __s_01 = (char *)malloc((long)(lena + lenb + 1));
  j = (int64_t)result->end_query;
  lStack_1a8 = (long)result->end_ref;
  HT._4_4_ = 4;
  piVar1 = ((result->field_4).rowcols)->score_row;
  segLen = (int64_t)((result->flag & 0x1000000U) != 0);
  if ((result->flag & 0x2000000U) != 0) {
    segLen = 2;
  }
  if ((result->flag & 0x4000000U) != 0) {
    segLen = 4;
  }
  if ((result->flag & 0x8000000U) != 0) {
    segLen = 8;
  }
  if ((result->flag & 0x10000000U) != 0) {
    segLen = 0x10;
  }
  if ((result->flag & 0x20000000U) != 0) {
    segLen = 0x20;
  }
  if ((result->flag & 0x40000000U) != 0) {
    segLen = 0x40;
  }
  lVar4 = (lena + segLen + -1) / segLen;
  if (alphabet_aliases_ != (char *)0x0) {
    traceback = (parasail_traceback_t *)strlen(alphabet_aliases_);
    if ((((ulong)traceback & 1) != 0) || ((parasail_traceback_t *)0xff < traceback)) {
      fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_traceback_striped_16",
              "aliases_size % 2 == 0 && aliases_size < 256");
      return (parasail_traceback_t *)0x0;
    }
    for (ppStack_1d0 = (parasail_traceback_t *)0x0; ppStack_1d0 < traceback;
        ppStack_1d0 = (parasail_traceback_t *)((long)&ppStack_1d0->query + 1)) {
      if (case_sensitive == 0) {
        iVar3 = toupper((int)alphabet_aliases_[(long)ppStack_1d0]);
        local_1e4 = (char)iVar3;
      }
      else {
        local_1e4 = alphabet_aliases_[(long)ppStack_1d0];
      }
      *(char *)((long)&aliases_size + (long)ppStack_1d0) = local_1e4;
    }
  }
  i = (int64_t)__s_01;
  ac = __s_00;
  dc = __s;
  if ((result->flag & 2U) != 0) {
    if (result->end_query + 1 == lena) {
      for (loc._4_4_ = lenb + -1; lStack_1a8 < loc._4_4_; loc._4_4_ = loc._4_4_ + -1) {
        *dc = '-';
        *ac = seqB[loc._4_4_];
        *(undefined1 *)i = 0x20;
        i = i + 1;
        ac = ac + 1;
        dc = dc + 1;
      }
    }
    else {
      if (result->end_ref + 1 != lenb) {
        fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_traceback_striped_16",
                "0 && \"internal error\"");
        return (parasail_traceback_t *)0x0;
      }
      for (loc._4_4_ = lena + -1; j < loc._4_4_; loc._4_4_ = loc._4_4_ + -1) {
        cVar2 = missing_char(seqA,loc._4_4_);
        *dc = cVar2;
        *ac = '-';
        *(undefined1 *)i = 0x20;
        i = i + 1;
        ac = ac + 1;
        dc = dc + 1;
      }
    }
  }
  do {
    if (j < 0 && lStack_1a8 < 0) {
LAB_0057d717:
      *dc = '\0';
      *ac = '\0';
      *(undefined1 *)i = 0;
      ppVar6 = (parasail_traceback_t *)malloc(0x18);
      sVar7 = strlen(__s);
      pcVar8 = parasail_reverse(__s,sVar7);
      ppVar6->query = pcVar8;
      sVar7 = strlen(__s_01);
      pcVar8 = parasail_reverse(__s_01,sVar7);
      ppVar6->comp = pcVar8;
      sVar7 = strlen(__s_00);
      pcVar8 = parasail_reverse(__s_00,sVar7);
      ppVar6->ref = pcVar8;
      free(__s);
      free(__s_00);
      free(__s_01);
      return ppVar6;
    }
    lVar5 = lStack_1a8 * lVar4 * segLen + (j % lVar4) * segLen + j / lVar4;
    if (j < 0) {
      if ((result->flag & 4U) == 0) {
        for (; -1 < lStack_1a8; lStack_1a8 = lStack_1a8 + -1) {
          *dc = '-';
          *ac = seqB[lStack_1a8];
          *(undefined1 *)i = 0x20;
          i = i + 1;
          ac = ac + 1;
          dc = dc + 1;
        }
      }
      goto LAB_0057d717;
    }
    if (lStack_1a8 < 0) {
      if ((result->flag & 4U) == 0) {
        for (; -1 < j; j = j + -1) {
          cVar2 = missing_char(seqA,(int)j);
          *dc = cVar2;
          *ac = '-';
          *(undefined1 *)i = 0x20;
          i = i + 1;
          ac = ac + 1;
          dc = dc + 1;
        }
      }
      goto LAB_0057d717;
    }
    iVar3 = (int)j;
    if (HT._4_4_ == 4) {
      if ((*(ushort *)((long)piVar1 + lVar5 * 2) & 4) == 0) {
        if ((*(ushort *)((long)piVar1 + lVar5 * 2) & 1) == 0) {
          if ((*(ushort *)((long)piVar1 + lVar5 * 2) & 2) == 0) goto LAB_0057d717;
          HT._4_4_ = 2;
        }
        else {
          HT._4_4_ = 1;
        }
      }
      else {
        cVar2 = missing_char(seqA,iVar3);
        *dc = cVar2;
        *ac = seqB[lStack_1a8];
        cVar2 = match_char(seqA,iVar3,seqB,(int)lStack_1a8,matrix,match,pos,neg,case_sensitive,
                           (char *)&aliases_size,(size_t)traceback);
        *(char *)i = cVar2;
        j = j + -1;
        lStack_1a8 = lStack_1a8 + -1;
        i = i + 1;
        ac = ac + 1;
        dc = dc + 1;
      }
    }
    else {
      if (HT._4_4_ == 1) {
        *dc = '-';
        *ac = seqB[lStack_1a8];
        *(undefined1 *)i = 0x20;
        lStack_1a8 = lStack_1a8 + -1;
        if ((*(ushort *)((long)piVar1 + lVar5 * 2) & 8) == 0) {
          if ((*(ushort *)((long)piVar1 + lVar5 * 2) & 0x10) == 0) {
            fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_traceback_striped_16",
                    "0 && \"internal error\"");
            return (parasail_traceback_t *)0x0;
          }
          HT._4_4_ = 1;
        }
        else {
          HT._4_4_ = 4;
        }
      }
      else {
        if (HT._4_4_ != 2) {
          if (HT._4_4_ != 0) {
            fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_traceback_striped_16",
                    "0 && \"internal error\"");
            return (parasail_traceback_t *)0x0;
          }
          goto LAB_0057d717;
        }
        cVar2 = missing_char(seqA,iVar3);
        *dc = cVar2;
        *ac = '-';
        *(undefined1 *)i = 0x20;
        j = j + -1;
        if ((*(ushort *)((long)piVar1 + lVar5 * 2) & 0x20) == 0) {
          if ((*(ushort *)((long)piVar1 + lVar5 * 2) & 0x40) == 0) {
            fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_traceback_striped_16",
                    "0 && \"internal error\"");
            return (parasail_traceback_t *)0x0;
          }
          HT._4_4_ = 2;
        }
        else {
          HT._4_4_ = 4;
        }
      }
      dc = dc + 1;
      ac = ac + 1;
      i = i + 1;
    }
  } while( true );
}

Assistant:

static inline parasail_traceback_t* CONCAT(NAME, T) (
        parasail_result_t *result,
        const char *seqA,
        int lena,
        const char *seqB,
        int lenb,
        const parasail_matrix_t *matrix,
        char match, char pos, char neg,
        int case_sensitive,
        const char *alphabet_aliases_)
{
    char alphabet_aliases[256];
    size_t aliases_size = 0;
    parasail_traceback_t *traceback = NULL;
    char *q = malloc(sizeof(char)*(lena+lenb+1));
    char *d = malloc(sizeof(char)*(lena+lenb+1));
    char *a = malloc(sizeof(char)*(lena+lenb+1));
    char *qc = q;
    char *dc = d;
    char *ac = a;
    int64_t i = result->end_query;
    int64_t j = result->end_ref;
    int where = PARASAIL_DIAG;
    D *HT = (D*)result->trace->trace_table;
#if defined(STRIPED)
    int64_t segWidth = 0;
    int64_t segLen = 0;
    if (result->flag & PARASAIL_FLAG_LANES_1) {
        segWidth = 1;
    }
    if (result->flag & PARASAIL_FLAG_LANES_2) {
        segWidth = 2;
    }
    if (result->flag & PARASAIL_FLAG_LANES_4) {
        segWidth = 4;
    }
    if (result->flag & PARASAIL_FLAG_LANES_8) {
        segWidth = 8;
    }
    if (result->flag & PARASAIL_FLAG_LANES_16) {
        segWidth = 16;
    }
    if (result->flag & PARASAIL_FLAG_LANES_32) {
        segWidth = 32;
    }
    if (result->flag & PARASAIL_FLAG_LANES_64) {
        segWidth = 64;
    }
    segLen = (lena + segWidth - 1) / segWidth;
#endif
    if (NULL != alphabet_aliases_) {
        size_t i;
        aliases_size = strlen(alphabet_aliases_);
        PARASAIL_ASSERT(aliases_size % 2 == 0 && aliases_size < 256); // even number of characters in alias
        for (i=0; i<aliases_size; ++i) {
            alphabet_aliases[i] = case_sensitive ? alphabet_aliases_[i] :
                                                   toupper(alphabet_aliases_[i]);
        }
    }
    /* semi-global alignment includes the end gaps */
    if (result->flag & PARASAIL_FLAG_SG) {
        int k;
        if (result->end_query+1 == lena) {
            k = lenb-1;
            while (k > j) {
                *(qc++) = '-';
                *(dc++) = seqB[k];
                *(ac++) = ' ';
                --k;
            }
        }
        else if (result->end_ref+1 == lenb) {
            k = lena-1;
            while (k > i) {
                *(qc++) = missing_char(seqA, k);
                *(dc++) = '-';
                *(ac++) = ' ';
                --k;
            }
        }
        else {
            PARASAIL_ASSERT(0 && "internal error");
        }
    }
    while (i >= 0 || j >= 0) {
        LOC
        if (i < 0) {
            if (!(result->flag & PARASAIL_FLAG_SW)) {
                while (j >= 0) {
                    *(qc++) = '-';
                    *(dc++) = seqB[j];
                    *(ac++) = ' ';
                    --j;
                }
            }
            break;
        }
        if (j < 0) {
            if (!(result->flag & PARASAIL_FLAG_SW)) {
                while (i >= 0) {
                    *(qc++) = missing_char(seqA, i);
                    *(dc++) = '-';
                    *(ac++) = ' ';
                    --i;
                }
            }
            break;
        }
        if (PARASAIL_DIAG == where) {
            if (HT[loc] & PARASAIL_DIAG) {
                *(qc++) = missing_char(seqA, i);
                *(dc++) = seqB[j];
                *(ac++) = match_char(seqA, i, seqB, j, matrix, match, pos, neg, case_sensitive, alphabet_aliases, aliases_size);
                --i;
                --j;
            }
            else if (HT[loc] & PARASAIL_INS) {
                where = PARASAIL_INS;
            }
            else if (HT[loc] & PARASAIL_DEL) {
                where = PARASAIL_DEL;
            }
            else {
                break;
            }
        }
        else if (PARASAIL_INS == where) {
            *(qc++) = '-';
            *(dc++) = seqB[j];
            *(ac++) = ' ';
            --j;
            if (HT[loc] & PARASAIL_DIAG_E) {
                where = PARASAIL_DIAG;
            }
            else if (HT[loc] & PARASAIL_INS_E) {
                where = PARASAIL_INS;
            }
            else {
                PARASAIL_ASSERT(0 && "internal error");
            }
        }
        else if (PARASAIL_DEL == where) {
            *(qc++) = missing_char(seqA, i);
            *(dc++) = '-';
            *(ac++) = ' ';
            --i;
            if (HT[loc] & PARASAIL_DIAG_F) {
                where = PARASAIL_DIAG;
            }
            else if (HT[loc] & PARASAIL_DEL_F) {
                where = PARASAIL_DEL;
            }
            else {
                PARASAIL_ASSERT(0 && "internal error");
            }
        }
        else if (PARASAIL_ZERO == where) {
            break;
        }
        else {
            PARASAIL_ASSERT(0 && "internal error");
        }
    }
    *(qc++) = '\0';
    *(dc++) = '\0';
    *(ac++) = '\0';

    traceback = malloc(sizeof(parasail_traceback_t));
    traceback->query = parasail_reverse(q, strlen(q));
    traceback->comp = parasail_reverse(a, strlen(a));
    traceback->ref = parasail_reverse(d, strlen(d));

    free(q);
    free(d);
    free(a);

    return traceback;
}